

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O1

bool __thiscall indk::NeuralNet::isLearned(NeuralNet *this)

{
  bool bVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  
  p_Var3 = (this->Neurons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((bVar1 = (_Rb_tree_header *)p_Var3 == &(this->Neurons)._M_t._M_impl.super__Rb_tree_header,
         !bVar1 && (bVar2 = Neuron::isLearned(*(Neuron **)(p_Var3 + 2)), bVar2))) {
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  return bVar1;
}

Assistant:

bool indk::NeuralNet::isLearned() {
    for (const auto& N: Neurons) {
        if (!N.second -> isLearned()) return false;
    }
    return true;
}